

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int check_func_args(char *func_name)

{
  char local_58 [8];
  char string [64];
  char *func_name_local;
  
  if (expr_lablcnt == 1) {
    func_name_local._4_4_ = 1;
  }
  else {
    string._56_8_ = func_name;
    if (expr_lablcnt == 0) {
      sprintf(local_58,"No symbol in function %s!",func_name);
    }
    else {
      sprintf(local_58,"Too many symbols in function %s!",func_name);
    }
    error(local_58);
    func_name_local._4_4_ = 0;
  }
  return func_name_local._4_4_;
}

Assistant:

int
check_func_args(char *func_name)
{
	char string[64];

	if (expr_lablcnt == 1)
		return (1);
	else if (expr_lablcnt == 0)
		sprintf(string, "No symbol in function %s!", func_name);
	else {
		sprintf(string, "Too many symbols in function %s!", func_name);
	}

	/* output message */
	error(string);
	return (0);
}